

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O3

void __thiscall
TasGrid::TasmanianSparseGrid::integrate
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *q)

{
  BaseCanonicalGrid *pBVar1;
  size_type __new_size;
  
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    __new_size = 0;
  }
  else {
    __new_size = (size_type)pBVar1->num_outputs;
  }
  ::std::vector<double,_std::allocator<double>_>::resize(q,__new_size);
  integrate(this,(q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start);
  return;
}

Assistant:

void TasmanianSparseGrid::integrate(std::vector<double> &q) const{
    size_t num_outputs = getNumOutputs();
    q.resize(num_outputs);
    integrate(q.data());
}